

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53lxx.cpp
# Opt level: O2

void __thiscall
VL53LXX::VL53LXX(VL53LXX *this,uint8_t port,uint8_t address,int16_t xshutGPIOPin,bool ioMode2v8,
                float *calib)

{
  uint i;
  I2Cgeneric *this_00;
  long lVar1;
  
  this->_vptr_VL53LXX = (_func_int **)&PTR___cxa_pure_virtual_0010db50;
  this->xshutGPIOPin = xshutGPIOPin;
  this->ioMode2v8 = ioMode2v8;
  (this->gpioFilename)._M_dataplus._M_p = (pointer)&(this->gpioFilename).field_2;
  (this->gpioFilename)._M_string_length = 0;
  (this->gpioFilename).field_2._M_local_buf[0] = '\0';
  (this->fileAccessMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fileAccessMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->fileAccessMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fileAccessMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->fileAccessMutex).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)
   ((long)&(this->fileAccessMutex).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  this_00 = (I2Cgeneric *)operator_new(0x20);
  I2Cdev::I2Cdev((I2Cdev *)this_00,port,address);
  this->i2c = this_00;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    this->calib[lVar1] = calib[lVar1];
  }
  if (xshutGPIOPin != -1) {
    powerOn(this);
  }
  return;
}

Assistant:

VL53LXX::VL53LXX(uint8_t port, const uint8_t address, const int16_t xshutGPIOPin, bool ioMode2v8, float *calib):
    xshutGPIOPin(xshutGPIOPin),
    ioMode2v8(ioMode2v8)
{
    #ifdef BUILD_I2C_DEV
    this->i2c = new I2Cdev(port, address);
    #endif

    for(unsigned int i = 0; i < CALIB_SIZE; i++){
    this->calib[i] = calib[i];
    }

    if(xshutGPIOPin != -1){
        this->powerOn();
    }
}